

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassTemplate.h
# Opt level: O0

void __thiscall
kiste::ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
render_footer<kiste::class_t>
          (ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this,size_t line_no
          ,class_t *class_data)

{
  class_t *class_data_local;
  size_t line_no_local;
  ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this_local;
  
  line_directive(this,line_no);
  cpp::text(this->_serialize,"\n};\n\nstruct ");
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (this->_serialize,&class_data->_name);
  cpp::text(this->_serialize,"_generator\n{\n  ");
  line_directive(this,line_no);
  cpp::text(this->_serialize,
            "\n  template<typename DATA_T, typename SERIALIZER_T>\n  auto operator()(const DATA_T& data, SERIALIZER_T& serialize) const\n    -> "
           );
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (this->_serialize,&class_data->_name);
  cpp::text(this->_serialize,
            "_t<kiste::terminal_t, DATA_T, SERIALIZER_T>\n  {\n    return {kiste::terminal, data, serialize};\n  }\n};\nconstexpr auto "
           );
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (this->_serialize,&class_data->_name);
  cpp::text(this->_serialize," = ");
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (this->_serialize,&class_data->_name);
  cpp::text(this->_serialize,"_generator{};\n\n");
  line_directive(this,line_no);
  cpp::text(this->_serialize,"\n");
  return;
}

Assistant:

void render_footer(const size_t line_no, const ClassData& class_data)
    {
    static_assert(std::is_same<decltype(line_directive(line_no)), void>::value, "$call{} requires void expression"); (line_directive(line_no));_serialize.text("\n"
                    "};\n"
                    "\n"
                    "struct ");_serialize.escape(class_data._name);_serialize.text("_generator\n"
                    "{\n"
                    "  ");static_assert(std::is_same<decltype(line_directive(line_no)), void>::value, "$call{} requires void expression"); (line_directive(line_no));_serialize.text("\n"
                    "  template<typename DATA_T, typename SERIALIZER_T>\n"
                    "  auto operator()(const DATA_T& data, SERIALIZER_T& serialize) const\n"
                    "    -> ");_serialize.escape(class_data._name);_serialize.text("_t<kiste::terminal_t, DATA_T, SERIALIZER_T>\n"
                    "  {\n"
                    "    return {kiste::terminal, data, serialize};\n"
                    "  }\n"
                    "};\n"
                    "constexpr auto ");_serialize.escape(class_data._name);_serialize.text(" = ");_serialize.escape(class_data._name);_serialize.text("_generator{};\n"
                    "\n");
    static_assert(std::is_same<decltype(line_directive(line_no)), void>::value, "$call{} requires void expression"); (line_directive(line_no));_serialize.text("\n");
    }